

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

bool __thiscall
cmLocalUnixMakefileGenerator3::ScanDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *targetDir,string *dependFile,
          string *internalDependFile,DependencyMap *validDeps)

{
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  Encoding EVar3;
  int iVar4;
  string *psVar5;
  cmValue cVar6;
  cmValue topBinary;
  cmDependsC *this_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string_view value;
  cmList langs;
  cmGeneratedFileStream ruleFileStream;
  cmGeneratedFileStream internalRuleFileStream;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  DependencyMap *local_520;
  cmList local_518;
  undefined1 local_500 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  pointer local_4e0;
  undefined8 local_4d8;
  undefined1 local_298 [32];
  byte abStack_278 [584];
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_520 = validDeps;
  psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  local_500._8_8_ = (psVar5->_M_dataplus)._M_p;
  local_500._0_8_ = psVar5->_M_string_length;
  local_4f0._M_allocated_capacity = 0;
  local_4f0._8_8_ = 0x2b;
  local_4e0 = (pointer)0x8369bb;
  local_4d8 = 0;
  views._M_len = 2;
  views._M_array = (iterator)local_500;
  cmCatViews((string *)local_298,views);
  bVar2 = cmMakefile::ReadListFile(this_00,(string *)local_298);
  if (bVar2) {
    bVar2 = true;
    if ((cmSystemTools::s_ErrorOccurred == false) && (cmSystemTools::s_FatalErrorOccurred == false))
    {
      bVar2 = cmSystemTools::GetInterruptFlag();
    }
    if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
      operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
    }
    if (bVar2 == false) {
      local_500._0_8_ = &local_4f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_500,"CMAKE_FORCE_UNIX_PATHS","");
      cVar6 = cmMakefile::GetDefinition(this_00,(string *)local_500);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500._0_8_ != &local_4f0) {
        operator_delete((void *)local_500._0_8_,(ulong)(local_4f0._M_allocated_capacity + 1));
      }
      if ((cVar6.Value != (string *)0x0) &&
         (value._M_str = ((cVar6.Value)->_M_dataplus)._M_p,
         value._M_len = (cVar6.Value)->_M_string_length, bVar2 = cmValue::IsOff(value), !bVar2)) {
        cmSystemTools::s_ForceUnixPaths = true;
      }
      local_500._0_8_ = &local_4f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_500,"CMAKE_RELATIVE_PATH_TOP_SOURCE","");
      cVar6 = cmMakefile::GetDefinition(this_00,(string *)local_500);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500._0_8_ != &local_4f0) {
        operator_delete((void *)local_500._0_8_,(ulong)(local_4f0._M_allocated_capacity + 1));
      }
      local_500._0_8_ = &local_4f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_500,"CMAKE_RELATIVE_PATH_TOP_BINARY","");
      topBinary = cmMakefile::GetDefinition(this_00,(string *)local_500);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_500._0_8_ != &local_4f0) {
        operator_delete((void *)local_500._0_8_,(ulong)(local_4f0._M_allocated_capacity + 1));
      }
      if (topBinary.Value != (string *)0x0 && cVar6.Value != (string *)0x0) {
        cmOutputConverter::SetRelativePathTop((cmOutputConverter *)this,cVar6.Value,topBinary.Value)
        ;
      }
      goto LAB_0052ea71;
    }
  }
  else if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  local_500._0_8_ = &local_4f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_500,"Directory Information file not found","");
  cmSystemTools::Error((string *)local_500);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._0_8_ != &local_4f0) {
    operator_delete((void *)local_500._0_8_,(ulong)(local_4f0._M_allocated_capacity + 1));
  }
LAB_0052ea71:
  EVar3 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_500,dependFile,false,EVar3);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_500,true);
  if ((*(byte *)((long)&local_4e0 + *(long *)(local_500._0_8_ + -0x18)) & 5) == 0) {
    EVar3 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_298,internalDependFile,false,EVar3);
    bVar2 = (abStack_278[*(long *)(local_298._0_8_ + -0x18)] & 5) == 0;
    if (bVar2) {
      WriteDisclaimer(this,(ostream *)local_500);
      WriteDisclaimer(this,(ostream *)local_298);
      local_540._0_8_ = (cmLocalUnixMakefileGenerator3 *)(local_540 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_540,"CMAKE_DEPENDS_LANGUAGES","");
      psVar5 = cmMakefile::GetSafeDefinition(this_00,(string *)local_540);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      local_560._0_8_ = (cmDependsC *)(local_560 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_560,pcVar1,pcVar1 + psVar5->_M_string_length);
      init._M_len = 1;
      init._M_array = (iterator)local_560;
      cmList::cmList(&local_518,init);
      if ((cmDependsC *)local_560._0_8_ != (cmDependsC *)(local_560 + 0x10)) {
        operator_delete((void *)local_560._0_8_,local_560._16_8_ + 1);
      }
      psVar5 = local_518.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((cmLocalUnixMakefileGenerator3 *)local_540._0_8_ !=
          (cmLocalUnixMakefileGenerator3 *)(local_540 + 0x10)) {
        operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
        psVar5 = local_518.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      for (; psVar5 != local_518.Values.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; psVar5 = psVar5 + 1) {
        iVar4 = std::__cxx11::string::compare((char *)psVar5);
        if ((((((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)psVar5), iVar4 == 0))
              || (iVar4 = std::__cxx11::string::compare((char *)psVar5), iVar4 == 0)) ||
             ((iVar4 = std::__cxx11::string::compare((char *)psVar5), iVar4 == 0 ||
              (iVar4 = std::__cxx11::string::compare((char *)psVar5), iVar4 == 0)))) ||
            ((iVar4 = std::__cxx11::string::compare((char *)psVar5), iVar4 == 0 ||
             ((iVar4 = std::__cxx11::string::compare((char *)psVar5), iVar4 == 0 ||
              (iVar4 = std::__cxx11::string::compare((char *)psVar5), iVar4 == 0)))))) ||
           (iVar4 = std::__cxx11::string::compare((char *)psVar5), iVar4 == 0)) {
          this_01 = (cmDependsC *)operator_new(0xaf0);
          cmDependsC::cmDependsC(this_01,this,targetDir,psVar5,local_520);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)psVar5);
          if (iVar4 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_500,"# Note that incremental build could trigger ",0x2c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_500,"a call to cmake_copy_f90_mod on each re-build\n",0x2e);
            local_540._0_8_ = this;
            std::make_unique<cmDependsFortran,cmLocalUnixMakefileGenerator3*>
                      ((cmLocalUnixMakefileGenerator3 **)local_560);
            this_01 = (cmDependsC *)local_560._0_8_;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)psVar5);
            if (iVar4 == 0) {
              std::make_unique<cmDependsJava>();
              this_01 = (cmDependsC *)local_560._0_8_;
            }
            else {
              this_01 = (cmDependsC *)0x0;
            }
          }
        }
        if (this_01 != (cmDependsC *)0x0) {
          (this_01->super_cmDepends).LocalGenerator = this;
          (this_01->super_cmDepends).FileTimeCache =
               (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                CMakeInstance->FileTimeCache)._M_t.
               super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>._M_t.
               super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>.
               super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl;
          std::__cxx11::string::_M_assign((string *)&(this_01->super_cmDepends).Language);
          std::__cxx11::string::_M_assign((string *)&(this_01->super_cmDepends).TargetDirectory);
          cmDepends::Write(&this_01->super_cmDepends,(ostream *)local_500,(ostream *)local_298);
          (*(this_01->super_cmDepends)._vptr_cmDepends[1])(this_01);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_518.Values);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  }
  else {
    bVar2 = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_500);
  return bVar2;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::ScanDependencies(
  std::string const& targetDir, std::string const& dependFile,
  std::string const& internalDependFile, cmDepends::DependencyMap& validDeps)
{
  // Read the directory information file.
  cmMakefile* mf = this->Makefile;
  bool haveDirectoryInfo = false;
  {
    std::string dirInfoFile =
      cmStrCat(this->GetCurrentBinaryDirectory(),
               "/CMakeFiles/CMakeDirectoryInformation.cmake");
    if (mf->ReadListFile(dirInfoFile) &&
        !cmSystemTools::GetErrorOccurredFlag()) {
      haveDirectoryInfo = true;
    }
  }

  // Lookup useful directory information.
  if (haveDirectoryInfo) {
    // Test whether we need to force Unix paths.
    if (cmValue force = mf->GetDefinition("CMAKE_FORCE_UNIX_PATHS")) {
      if (!force.IsOff()) {
        cmSystemTools::SetForceUnixPaths(true);
      }
    }

    // Setup relative path top directories.
    cmValue relativePathTopSource =
      mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_SOURCE");
    cmValue relativePathTopBinary =
      mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_BINARY");
    if (relativePathTopSource && relativePathTopBinary) {
      this->SetRelativePathTop(*relativePathTopSource, *relativePathTopBinary);
    }
  } else {
    cmSystemTools::Error("Directory Information file not found");
  }

  // Open the make depends file.  This should be copy-if-different
  // because the make tool may try to reload it needlessly otherwise.
  cmGeneratedFileStream ruleFileStream(
    dependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  ruleFileStream.SetCopyIfDifferent(true);
  if (!ruleFileStream) {
    return false;
  }

  // Open the cmake dependency tracking file.  This should not be
  // copy-if-different because dependencies are re-scanned when it is
  // older than the DependInfo.cmake.
  cmGeneratedFileStream internalRuleFileStream(
    internalDependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  if (!internalRuleFileStream) {
    return false;
  }

  this->WriteDisclaimer(ruleFileStream);
  this->WriteDisclaimer(internalRuleFileStream);

  // for each language we need to scan, scan it
  cmList langs{ mf->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES") };
  for (std::string const& lang : langs) {
    // construct the checker
    // Create the scanner for this language
    std::unique_ptr<cmDepends> scanner;
    if (lang == "C" || lang == "CXX" || lang == "RC" || lang == "ASM" ||
        lang == "OBJC" || lang == "OBJCXX" || lang == "CUDA" ||
        lang == "HIP" || lang == "ISPC") {
      // TODO: Handle RC (resource files) dependencies correctly.
      scanner = cm::make_unique<cmDependsC>(this, targetDir, lang, &validDeps);
    }
#ifndef CMAKE_BOOTSTRAP
    else if (lang == "Fortran") {
      ruleFileStream << "# Note that incremental build could trigger "
                     << "a call to cmake_copy_f90_mod on each re-build\n";
      scanner = cm::make_unique<cmDependsFortran>(this);
    } else if (lang == "Java") {
      scanner = cm::make_unique<cmDependsJava>();
    }
#endif

    if (scanner) {
      scanner->SetLocalGenerator(this);
      scanner->SetFileTimeCache(
        this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache());
      scanner->SetLanguage(lang);
      scanner->SetTargetDirectory(targetDir);
      scanner->Write(ruleFileStream, internalRuleFileStream);
    }
  }

  return true;
}